

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O0

void __thiscall
HashUtil_Sha256ByteScript_Test::~HashUtil_Sha256ByteScript_Test
          (HashUtil_Sha256ByteScript_Test *this)

{
  HashUtil_Sha256ByteScript_Test *this_local;
  
  ~HashUtil_Sha256ByteScript_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(HashUtil, Sha256ByteScript) {
  Script target(
      "21026dccc749adc2a9d0d89497ac511f760f45c47dc5ed9cf352a58ac706453880aeadab210255a9626aebf5e29c0e6538428ba0d1dcf6ca98ffdf086aa8ced5e0d0215ea465ac");
  ByteData256 byte_data = HashUtil::Sha256(target);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "5d1b56b63d714eebe542309525f484b7e9d6f686b3781b6f61ef925d66d6f6a0");
}